

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall
cmDocumentation::CheckOptions(cmDocumentation *this,int argc,char **argv,char *exitOpt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  cmDocumentation *pcVar7;
  cmDocumentation *pcVar8;
  bool result;
  char **local_b0;
  RequestedHelpItem help;
  string local_50;
  
  paVar1 = &help.Filename.field_2;
  local_b0 = argv;
  if (argc == 1) {
    help.Argument._M_dataplus._M_p = (pointer)&help.Argument.field_2;
    help.Filename._M_string_length = 0;
    help.Filename.field_2._M_local_buf[0] = '\0';
    help.Argument._M_string_length = 0;
    help.Argument.field_2._M_local_buf[0] = '\0';
    help.HelpType = Usage;
    help.Filename._M_dataplus._M_p = (pointer)paVar1;
    std::
    vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
    ::push_back(&this->RequestedHelpItems,&help);
    RequestedHelpItem::~RequestedHelpItem(&help);
    result = true;
  }
  else {
    result = false;
    iVar3 = 1;
    do {
      iVar5 = iVar3;
      if (argc <= iVar5) break;
      pcVar8 = (cmDocumentation *)local_b0[iVar5];
      if ((exitOpt != (char *)0x0) && (iVar3 = strcmp((char *)pcVar8,exitOpt), iVar3 == 0))
      goto LAB_002c2a6b;
      help.HelpType = None;
      help.Filename._M_string_length = 0;
      help.Filename.field_2._M_local_buf[0] = '\0';
      help.Argument._M_dataplus._M_p = (pointer)&help.Argument.field_2;
      help.Argument._M_string_length = 0;
      help.Argument.field_2._M_local_buf[0] = '\0';
      pcVar7 = pcVar8;
      help.Filename._M_dataplus._M_p = (pointer)paVar1;
      iVar4 = strcmp((char *)pcVar8,"-help");
      iVar3 = iVar5;
      if ((((iVar4 == 0) || (pcVar7 = pcVar8, iVar4 = strcmp((char *)pcVar8,"--help"), iVar4 == 0))
          || ((((bVar2 = pcVar8->ShowGenerators, bVar2 == true && (pcVar8->field_0x1 == '?')) &&
               (pcVar8->field_0x2 == '\0')) ||
              (pcVar7 = pcVar8, iVar4 = strcmp((char *)pcVar8,"-usage"), iVar4 == 0)))) ||
         ((bVar2 == true &&
          (((pcVar8->field_0x1 == 'h' && (pcVar8->field_0x2 == '\0')) ||
           ((pcVar8->field_0x1 == 'H' && (pcVar8->field_0x2 == '\0')))))))) {
        help.HelpType = Help;
        iVar4 = iVar5 + 1;
        if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
          std::__cxx11::string::assign((char *)&help.Argument);
          iVar3 = iVar4;
        }
        cmsys::SystemTools::LowerCase(&local_50,&help.Argument);
        std::__cxx11::string::operator=((string *)&help.Argument,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (help.Argument._M_string_length != 0) {
          help.HelpType = OneCommand;
          goto LAB_002c2402;
        }
LAB_002c23fb:
        if (help.HelpType == None) {
          bVar2 = true;
        }
        else {
LAB_002c2402:
          result = true;
          bVar2 = true;
          std::
          vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
          ::push_back(&this->RequestedHelpItems,&help);
        }
      }
      else {
        iVar4 = strcmp((char *)pcVar8,"--help-properties");
        if (iVar4 == 0) {
          help.HelpType = OneManual;
          pcVar8 = (cmDocumentation *)&help.Argument;
          std::__cxx11::string::assign((char *)pcVar8);
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar8,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          WarnFormFromFilename(&help,&result);
          goto LAB_002c23fb;
        }
        iVar4 = strcmp((char *)pcVar8,"--help-policies");
        if (iVar4 == 0) {
          help.HelpType = OneManual;
          pcVar8 = (cmDocumentation *)&help.Argument;
          std::__cxx11::string::assign((char *)pcVar8);
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar8,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          WarnFormFromFilename(&help,&result);
          goto LAB_002c23fb;
        }
        iVar4 = strcmp((char *)pcVar8,"--help-variables");
        if (iVar4 == 0) {
          help.HelpType = OneManual;
          pcVar8 = (cmDocumentation *)&help.Argument;
          std::__cxx11::string::assign((char *)pcVar8);
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar8,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          WarnFormFromFilename(&help,&result);
          goto LAB_002c23fb;
        }
        iVar4 = strcmp((char *)pcVar8,"--help-modules");
        if (iVar4 == 0) {
          help.HelpType = OneManual;
          pcVar8 = (cmDocumentation *)&help.Argument;
          std::__cxx11::string::assign((char *)pcVar8);
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar8,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          WarnFormFromFilename(&help,&result);
          goto LAB_002c23fb;
        }
        pcVar7 = pcVar8;
        iVar4 = strcmp((char *)pcVar8,"--help-custom-modules");
        if (iVar4 == 0) {
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          cmSystemTools::Message("Warning: --help-custom-modules no longer supported",(char *)0x0);
          if (help.Filename._M_string_length == 0) {
            bVar2 = false;
            goto LAB_002c2419;
          }
          help.HelpType = OldCustomModules;
          cmsys::SystemTools::GetFilenameName(&local_50,&help.Filename);
          std::__cxx11::string::operator=((string *)&help.Argument,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          goto LAB_002c23fb;
        }
        iVar4 = strcmp((char *)pcVar8,"--help-commands");
        if (iVar4 == 0) {
          help.HelpType = OneManual;
          pcVar8 = (cmDocumentation *)&help.Argument;
          std::__cxx11::string::assign((char *)pcVar8);
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar8,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          WarnFormFromFilename(&help,&result);
          goto LAB_002c23fb;
        }
        pcVar7 = pcVar8;
        iVar4 = strcmp((char *)pcVar8,"--help-compatcommands");
        if (iVar4 == 0) {
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          bVar2 = false;
          cmSystemTools::Message("Warning: --help-compatcommands no longer supported",(char *)0x0);
          goto LAB_002c2419;
        }
        pcVar7 = pcVar8;
        iVar4 = strcmp((char *)pcVar8,"--help-full");
        if (iVar4 == 0) {
          help.HelpType = Full;
          iVar4 = iVar5 + 1;
          if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
            std::__cxx11::string::assign((char *)&help.Filename);
            iVar3 = iVar4;
          }
          WarnFormFromFilename(&help,&result);
          goto LAB_002c23fb;
        }
        pcVar7 = pcVar8;
        iVar4 = strcmp((char *)pcVar8,"--help-html");
        if (iVar4 != 0) {
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-man");
          if (iVar4 == 0) {
            iVar4 = iVar5 + 1;
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            bVar2 = false;
            cmSystemTools::Message("Warning: --help-man no longer supported",(char *)0x0);
            goto LAB_002c2419;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-command");
          if (iVar4 == 0) {
            help.HelpType = OneCommand;
            iVar6 = iVar5 + 1;
            iVar4 = iVar6;
            if ((iVar6 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar6]), !bVar2)) {
              pcVar7 = (cmDocumentation *)&help.Argument;
              std::__cxx11::string::assign((char *)pcVar7);
              iVar4 = iVar5 + 2;
              iVar3 = iVar6;
            }
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            cmsys::SystemTools::LowerCase(&local_50,&help.Argument);
            std::__cxx11::string::operator=((string *)&help.Argument,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            WarnFormFromFilename(&help,&result);
            goto LAB_002c23fb;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-module");
          if (iVar4 == 0) {
            help.HelpType = OneModule;
            iVar6 = iVar5 + 1;
            iVar4 = iVar6;
            if ((iVar6 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar6]), !bVar2)) {
              pcVar7 = (cmDocumentation *)&help.Argument;
              std::__cxx11::string::assign((char *)pcVar7);
              iVar4 = iVar5 + 2;
              iVar3 = iVar6;
            }
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            WarnFormFromFilename(&help,&result);
            goto LAB_002c23fb;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-property");
          if (iVar4 == 0) {
            help.HelpType = OneProperty;
            iVar6 = iVar5 + 1;
            iVar4 = iVar6;
            if ((iVar6 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar6]), !bVar2)) {
              pcVar7 = (cmDocumentation *)&help.Argument;
              std::__cxx11::string::assign((char *)pcVar7);
              iVar4 = iVar5 + 2;
              iVar3 = iVar6;
            }
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            WarnFormFromFilename(&help,&result);
            goto LAB_002c23fb;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-policy");
          if (iVar4 == 0) {
            help.HelpType = OnePolicy;
            iVar6 = iVar5 + 1;
            iVar4 = iVar6;
            if ((iVar6 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar6]), !bVar2)) {
              pcVar7 = (cmDocumentation *)&help.Argument;
              std::__cxx11::string::assign((char *)pcVar7);
              iVar4 = iVar5 + 2;
              iVar3 = iVar6;
            }
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            WarnFormFromFilename(&help,&result);
            goto LAB_002c23fb;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-variable");
          if (iVar4 == 0) {
            help.HelpType = OneVariable;
            iVar6 = iVar5 + 1;
            iVar4 = iVar6;
            if ((iVar6 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar6]), !bVar2)) {
              pcVar7 = (cmDocumentation *)&help.Argument;
              std::__cxx11::string::assign((char *)pcVar7);
              iVar4 = iVar5 + 2;
              iVar3 = iVar6;
            }
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            WarnFormFromFilename(&help,&result);
            goto LAB_002c23fb;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-manual");
          if (iVar4 == 0) {
            help.HelpType = OneManual;
            iVar6 = iVar5 + 1;
            iVar4 = iVar6;
            if ((iVar6 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar6]), !bVar2)) {
              pcVar7 = (cmDocumentation *)&help.Argument;
              std::__cxx11::string::assign((char *)pcVar7);
              iVar4 = iVar5 + 2;
              iVar3 = iVar6;
            }
            if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            WarnFormFromFilename(&help,&result);
            goto LAB_002c23fb;
          }
          pcVar7 = pcVar8;
          iVar4 = strcmp((char *)pcVar8,"--help-command-list");
          if (iVar4 != 0) {
            pcVar7 = pcVar8;
            iVar4 = strcmp((char *)pcVar8,"--help-module-list");
            if (iVar4 == 0) {
              help.HelpType = ListModules;
              iVar4 = iVar5 + 1;
              if (argc <= iVar4) goto LAB_002c2402;
              bVar2 = IsOption(pcVar7,local_b0[iVar4]);
              if (!bVar2) {
                std::__cxx11::string::assign((char *)&help.Filename);
                iVar3 = iVar4;
              }
            }
            else {
              pcVar7 = pcVar8;
              iVar4 = strcmp((char *)pcVar8,"--help-property-list");
              if (iVar4 == 0) {
                help.HelpType = ListProperties;
                iVar4 = iVar5 + 1;
                if (argc <= iVar4) goto LAB_002c2402;
                bVar2 = IsOption(pcVar7,local_b0[iVar4]);
                if (!bVar2) {
                  std::__cxx11::string::assign((char *)&help.Filename);
                  iVar3 = iVar4;
                }
              }
              else {
                pcVar7 = pcVar8;
                iVar4 = strcmp((char *)pcVar8,"--help-variable-list");
                if (iVar4 == 0) {
                  help.HelpType = ListVariables;
                  iVar4 = iVar5 + 1;
                  if (argc <= iVar4) goto LAB_002c2402;
                  bVar2 = IsOption(pcVar7,local_b0[iVar4]);
                  if (!bVar2) {
                    std::__cxx11::string::assign((char *)&help.Filename);
                    iVar3 = iVar4;
                  }
                }
                else {
                  pcVar7 = pcVar8;
                  iVar4 = strcmp((char *)pcVar8,"--help-policy-list");
                  if (iVar4 == 0) {
                    help.HelpType = ListPolicies;
                    iVar4 = iVar5 + 1;
                    if (argc <= iVar4) goto LAB_002c2402;
                    bVar2 = IsOption(pcVar7,local_b0[iVar4]);
                    if (!bVar2) {
                      std::__cxx11::string::assign((char *)&help.Filename);
                      iVar3 = iVar4;
                    }
                  }
                  else {
                    pcVar7 = pcVar8;
                    iVar4 = strcmp((char *)pcVar8,"--help-manual-list");
                    if (iVar4 == 0) {
                      help.HelpType = ListManuals;
                      iVar4 = iVar5 + 1;
                      if (argc <= iVar4) goto LAB_002c2402;
                      bVar2 = IsOption(pcVar7,local_b0[iVar4]);
                      if (!bVar2) {
                        std::__cxx11::string::assign((char *)&help.Filename);
                        iVar3 = iVar4;
                      }
                    }
                    else {
                      pcVar7 = pcVar8;
                      iVar4 = strcmp((char *)pcVar8,"--copyright");
                      if (iVar4 == 0) {
                        iVar4 = iVar5 + 1;
                        if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
                          std::__cxx11::string::assign((char *)&help.Filename);
                          iVar3 = iVar4;
                        }
                        bVar2 = false;
                        cmSystemTools::Message
                                  ("Warning: --copyright no longer supported",(char *)0x0);
                        goto LAB_002c2419;
                      }
                      pcVar7 = pcVar8;
                      iVar4 = strcmp((char *)pcVar8,"--version");
                      if (((iVar4 == 0) ||
                          (pcVar7 = pcVar8, iVar4 = strcmp((char *)pcVar8,"-version"), iVar4 == 0))
                         || ((bVar2 == true &&
                             ((pcVar8->field_0x1 == 'V' && (pcVar8->field_0x2 == '\0')))))) {
                        help.HelpType = Version;
                        iVar4 = iVar5 + 1;
                        if (argc <= iVar4) goto LAB_002c2402;
                        bVar2 = IsOption(pcVar7,local_b0[iVar4]);
                        if (!bVar2) {
                          std::__cxx11::string::assign((char *)&help.Filename);
                          iVar3 = iVar4;
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_002c23fb;
          }
          help.HelpType = ListCommands;
          iVar4 = iVar5 + 1;
          if (iVar4 < argc) {
            bVar2 = IsOption(pcVar7,local_b0[iVar4]);
            if (!bVar2) {
              std::__cxx11::string::assign((char *)&help.Filename);
              iVar3 = iVar4;
            }
            goto LAB_002c23fb;
          }
          goto LAB_002c2402;
        }
        iVar4 = iVar5 + 1;
        if ((iVar4 < argc) && (bVar2 = IsOption(pcVar7,local_b0[iVar4]), !bVar2)) {
          std::__cxx11::string::assign((char *)&help.Filename);
          iVar3 = iVar4;
        }
        bVar2 = false;
        cmSystemTools::Message("Warning: --help-html no longer supported",(char *)0x0);
      }
LAB_002c2419:
      RequestedHelpItem::~RequestedHelpItem(&help);
      iVar3 = iVar3 + 1;
    } while (bVar2);
    result = (bool)(iVar5 < argc | result);
  }
LAB_002c2a6b:
  return (bool)(result & 1);
}

Assistant:

bool cmDocumentation::CheckOptions(int argc, const char* const* argv,
                                   const char* exitOpt)
{
  // Providing zero arguments gives usage information.
  if(argc == 1)
    {
    RequestedHelpItem help;
    help.HelpType = cmDocumentation::Usage;
    this->RequestedHelpItems.push_back(help);
    return true;
    }

  // Search for supported help options.

  bool result = false;
  for(int i=1; i < argc; ++i)
    {
    if(exitOpt && strcmp(argv[i], exitOpt) == 0)
      {
      return result;
      }
    RequestedHelpItem help;
    // Check if this is a supported help option.
    if((strcmp(argv[i], "-help") == 0) ||
       (strcmp(argv[i], "--help") == 0) ||
       (strcmp(argv[i], "/?") == 0) ||
       (strcmp(argv[i], "-usage") == 0) ||
       (strcmp(argv[i], "-h") == 0) ||
       (strcmp(argv[i], "-H") == 0))
      {
      help.HelpType = cmDocumentation::Help;
      GET_OPT_ARGUMENT(help.Argument);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      // special case for single command
      if (!help.Argument.empty())
        {
        help.HelpType = cmDocumentation::OneCommand;
        }
      }
    else if(strcmp(argv[i], "--help-properties") == 0)
      {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-properties.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-policies") == 0)
      {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-policies.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-variables") == 0)
      {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-variables.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-modules") == 0)
      {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-modules.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-custom-modules") == 0)
      {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-custom-modules no longer supported");
      if(help.Filename.empty())
        {
        return true;
        }
      // Avoid breaking old project builds completely by at least generating
      // the output file.  Abuse help.Argument to give the file name to
      // PrintOldCustomModules without disrupting our internal API.
      help.HelpType = cmDocumentation::OldCustomModules;
      help.Argument = cmSystemTools::GetFilenameName(help.Filename);
      }
    else if(strcmp(argv[i], "--help-commands") == 0)
      {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-commands.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-compatcommands") == 0)
      {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-compatcommands no longer supported");
      return true;
      }
    else if(strcmp(argv[i], "--help-full") == 0)
      {
      help.HelpType = cmDocumentation::Full;
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-html") == 0)
      {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-html no longer supported");
      return true;
      }
    else if(strcmp(argv[i], "--help-man") == 0)
      {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-man no longer supported");
      return true;
      }
    else if(strcmp(argv[i], "--help-command") == 0)
      {
      help.HelpType = cmDocumentation::OneCommand;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-module") == 0)
      {
      help.HelpType = cmDocumentation::OneModule;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-property") == 0)
      {
      help.HelpType = cmDocumentation::OneProperty;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-policy") == 0)
      {
      help.HelpType = cmDocumentation::OnePolicy;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-variable") == 0)
      {
      help.HelpType = cmDocumentation::OneVariable;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-manual") == 0)
      {
      help.HelpType = cmDocumentation::OneManual;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
      }
    else if(strcmp(argv[i], "--help-command-list") == 0)
      {
      help.HelpType = cmDocumentation::ListCommands;
      GET_OPT_ARGUMENT(help.Filename);
      }
    else if(strcmp(argv[i], "--help-module-list") == 0)
      {
      help.HelpType = cmDocumentation::ListModules;
      GET_OPT_ARGUMENT(help.Filename);
      }
    else if(strcmp(argv[i], "--help-property-list") == 0)
      {
      help.HelpType = cmDocumentation::ListProperties;
      GET_OPT_ARGUMENT(help.Filename);
      }
    else if(strcmp(argv[i], "--help-variable-list") == 0)
      {
      help.HelpType = cmDocumentation::ListVariables;
      GET_OPT_ARGUMENT(help.Filename);
      }
    else if(strcmp(argv[i], "--help-policy-list") == 0)
      {
      help.HelpType = cmDocumentation::ListPolicies;
      GET_OPT_ARGUMENT(help.Filename);
      }
    else if(strcmp(argv[i], "--help-manual-list") == 0)
      {
      help.HelpType = cmDocumentation::ListManuals;
      GET_OPT_ARGUMENT(help.Filename);
      }
    else if(strcmp(argv[i], "--copyright") == 0)
      {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --copyright no longer supported");
      return true;
      }
    else if((strcmp(argv[i], "--version") == 0) ||
            (strcmp(argv[i], "-version") == 0) ||
            (strcmp(argv[i], "/V") == 0))
      {
      help.HelpType = cmDocumentation::Version;
      GET_OPT_ARGUMENT(help.Filename);
      }
    if(help.HelpType != None)
      {
      // This is a help option.  See if there is a file name given.
      result = true;
      this->RequestedHelpItems.push_back(help);
      }
    }
  return result;
}